

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkRect2D * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRect2D>
          (Impl *this,VkRect2D *src,size_t count,ScratchAllocator *alloc)

{
  VkRect2D *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkRect2D *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkRect2D>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkRect2D_const*,VkRect2D*>(src,src + count,(VkRect2D *)this_local);
    }
  }
  return (VkRect2D *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}